

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O3

ssize_t __thiscall
LASreadItemCompressed_RGB12_v1::read
          (LASreadItemCompressed_RGB12_v1 *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  ushort uVar2;
  U32 UVar3;
  I32 IVar4;
  uint *puVar5;
  undefined4 in_register_00000034;
  uint *puVar6;
  
  puVar6 = (uint *)CONCAT44(in_register_00000034,__fd);
  UVar3 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_byte_used);
  if ((UVar3 & 1) == 0) {
    uVar2 = (ushort)*this->last_item;
  }
  else {
    IVar4 = IntegerCompressor::decompress(this->ic_rgb,(uint)*this->last_item,0);
    uVar2 = (ushort)IVar4;
  }
  *(ushort *)puVar6 = uVar2;
  if ((UVar3 & 2) == 0) {
    uVar2 = uVar2 | (ushort)this->last_item[1] << 8;
  }
  else {
    IVar4 = IntegerCompressor::decompress(this->ic_rgb,(uint)this->last_item[1],1);
    uVar2 = (ushort)(IVar4 << 8) | (ushort)*puVar6;
  }
  *(ushort *)puVar6 = uVar2;
  if ((UVar3 & 4) == 0) {
    uVar2 = (ushort)this->last_item[2];
  }
  else {
    IVar4 = IntegerCompressor::decompress(this->ic_rgb,(uint)this->last_item[2],2);
    uVar2 = (ushort)IVar4;
  }
  *(ushort *)((long)puVar6 + 2) = uVar2;
  if ((UVar3 & 8) == 0) {
    uVar2 = uVar2 | (ushort)this->last_item[3] << 8;
  }
  else {
    IVar4 = IntegerCompressor::decompress(this->ic_rgb,(uint)this->last_item[3],3);
    uVar2 = (ushort)(IVar4 << 8) | *(ushort *)((long)puVar6 + 2);
  }
  *(ushort *)((long)puVar6 + 2) = uVar2;
  if ((UVar3 & 0x10) == 0) {
    uVar2 = (ushort)this->last_item[4];
  }
  else {
    IVar4 = IntegerCompressor::decompress(this->ic_rgb,(uint)this->last_item[4],4);
    uVar2 = (ushort)IVar4;
  }
  *(ushort *)(puVar6 + 1) = uVar2;
  if ((UVar3 & 0x20) == 0) {
    puVar5 = (uint *)this->last_item;
    *(ushort *)(puVar6 + 1) = uVar2 | (ushort)*(byte *)((long)puVar5 + 5) << 8;
  }
  else {
    IVar4 = IntegerCompressor::decompress(this->ic_rgb,(uint)this->last_item[5],5);
    *(ushort *)(puVar6 + 1) = (ushort)puVar6[1] | (ushort)(IVar4 << 8);
    puVar5 = (uint *)this->last_item;
  }
  *(ushort *)(puVar5 + 1) = (ushort)puVar6[1];
  uVar1 = *puVar6;
  *puVar5 = uVar1;
  return (ulong)uVar1;
}

Assistant:

inline void LASreadItemCompressed_RGB12_v1::read(U8* item, U32& context)
{
  U32 sym = dec->decodeSymbol(m_byte_used);
  if (sym & (1 << 0)) ((U16*)item)[0] = (U16)ic_rgb->decompress(((U16*)last_item)[0]&255, 0);
  else ((U16*)item)[0] = (U16)(((U16*)last_item)[0]&0xFF);
  if (sym & (1 << 1)) ((U16*)item)[0] |= (((U16)ic_rgb->decompress(((U16*)last_item)[0]>>8, 1)) << 8);
  else ((U16*)item)[0] |= (((U16*)last_item)[0]&0xFF00);
  if (sym & (1 << 2)) ((U16*)item)[1] = (U16)ic_rgb->decompress(((U16*)last_item)[1]&255, 2);
  else ((U16*)item)[1] = (U16)(((U16*)last_item)[1]&0xFF);
  if (sym & (1 << 3)) ((U16*)item)[1] |= (((U16)ic_rgb->decompress(((U16*)last_item)[1]>>8, 3)) << 8);
  else ((U16*)item)[1] |= (((U16*)last_item)[1]&0xFF00);
  if (sym & (1 << 4)) ((U16*)item)[2] = (U16)ic_rgb->decompress(((U16*)last_item)[2]&255, 4);
  else ((U16*)item)[2] = (U16)(((U16*)last_item)[2]&0xFF);
  if (sym & (1 << 5)) ((U16*)item)[2] |= (((U16)ic_rgb->decompress(((U16*)last_item)[2]>>8, 5)) << 8);
  else ((U16*)item)[2] |= (((U16*)last_item)[2]&0xFF00);
  memcpy(last_item, item, 6);
}